

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

char cs_impl::check_args_helper<cs::numeric,_2>::check(any *val)

{
  bool bVar1;
  string *str;
  char *in_stack_00000338;
  type_info *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff2c;
  
  any::type((any *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  bVar1 = std::type_info::operator!=
                    ((type_info *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffed8);
  if (!bVar1) {
    return '\0';
  }
  uVar2 = 1;
  str = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(in_stack_ffffffffffffff2c);
  std::operator+((char *)in_stack_fffffffffffffee8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffee0));
  std::operator+(in_stack_fffffffffffffee8,(char *)CONCAT17(uVar2,in_stack_fffffffffffffee0));
  get_name_of_type<cs::numeric>();
  cxx_demangle_abi_cxx11_(in_stack_00000338);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::operator+(in_stack_fffffffffffffee8,(char *)CONCAT17(uVar2,in_stack_fffffffffffffee0));
  any::get_type_name_abi_cxx11_((any *)in_stack_fffffffffffffee8);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  cs::runtime_error::runtime_error((runtime_error *)CONCAT17(uVar2,in_stack_fffffffffffffee0),str);
  __cxa_throw(str,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

static inline char check(const any &val)
		{
			if (typeid(T) != val.type())
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<T>()) + ", provided " + val.get_type_name());
			else
				return 0;
		}